

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::format_data_string_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,void *vmask,
          uint64_t flags)

{
  byte local_a9;
  string local_98;
  void *local_78;
  size_t x_1;
  size_t x;
  byte local_52;
  undefined1 local_51;
  bool mask_enabled;
  void *pvStack_50;
  size_t z;
  size_t sStack_40;
  bool is_printable;
  uint8_t *mask;
  uint8_t *data;
  uint64_t flags_local;
  void *vmask_local;
  size_t size_local;
  void *vdata_local;
  string *ret;
  
  z._7_1_ = (((ulong)vmask & 1) != 0 ^ 0xffU) & 1;
  if (z._7_1_ != 0) {
    pvStack_50 = (void *)0x0;
    while( true ) {
      local_a9 = 0;
      if (pvStack_50 < vdata) {
        local_a9 = z._7_1_;
      }
      if (local_a9 == 0) break;
      if ((((this[(long)pvStack_50] != (phosg)0xd) && (this[(long)pvStack_50] != (phosg)0xa)) &&
          (this[(long)pvStack_50] != (phosg)0x9)) &&
         (((byte)this[(long)pvStack_50] < 0x20 || (0x7e < (byte)this[(long)pvStack_50])))) {
        z._7_1_ = 0;
      }
      pvStack_50 = (void *)((long)pvStack_50 + 1);
    }
  }
  local_51 = 0;
  sStack_40 = size;
  mask = (uint8_t *)this;
  data = (uint8_t *)vmask;
  flags_local = size;
  vmask_local = vdata;
  size_local = (size_t)this;
  vdata_local = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_52 = 1;
  if ((z._7_1_ & 1) == 0) {
    for (local_78 = (void *)0x0; local_78 < vmask_local; local_78 = (void *)((long)local_78 + 1)) {
      if ((sStack_40 != 0) &&
         ((*(char *)(sStack_40 + (long)local_78) != '\0') != (bool)(local_52 & 1))) {
        local_52 = ~local_52 & 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,'?');
      }
      string_printf_abi_cxx11_(&local_98,"%02X",(ulong)mask[(long)local_78]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\"');
    for (x_1 = 0; x_1 < vmask_local; x_1 = x_1 + 1) {
      if ((sStack_40 != 0) && ((*(char *)(sStack_40 + x_1) != '\0') != (bool)(local_52 & 1))) {
        local_52 = ~local_52 & 1;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\"?\"");
      }
      if (mask[x_1] == '\r') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\\r");
      }
      else if (mask[x_1] == '\t') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\\t");
      }
      else if (mask[x_1] == '\n') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\\n");
      }
      else if (mask[x_1] == '\"') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\\\"");
      }
      else if (mask[x_1] == '\'') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,"\\\'");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,mask[x_1]);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\"');
  }
  return __return_storage_ptr__;
}

Assistant:

string format_data_string(const void* vdata, size_t size, const void* vmask, uint64_t flags) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);
  const uint8_t* mask = reinterpret_cast<const uint8_t*>(vmask);

  // If all bytes are ASCII-printable, render as a string instead
  bool is_printable = !(flags & FormatDataFlags::SKIP_STRINGS);
  if (is_printable) {
    for (size_t z = 0; z < size && is_printable; z++) {
      if (data[z] != '\r' && data[z] != '\n' && data[z] != '\t' && (data[z] < 0x20 || data[z] > 0x7E)) {
        is_printable = false;
      }
    }
  }

  string ret;
  bool mask_enabled = true;
  if (is_printable) {
    ret += '\"';
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += "\"?\"";
      }
      if (data[x] == '\r') {
        ret += "\\r";
      } else if (data[x] == '\t') {
        ret += "\\t";
      } else if (data[x] == '\n') {
        ret += "\\n";
      } else if (data[x] == '\"') {
        ret += "\\\"";
      } else if (data[x] == '\'') {
        ret += "\\\'";
      } else {
        ret.push_back(data[x]);
      }
    }
    ret += '\"';
  } else {
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += '?';
      }
      ret += string_printf("%02X", data[x]);
    }
  }
  return ret;
}